

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureBufferCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::anon_unknown_1::TextureFragmentShader::shadeFragments
          (TextureFragmentShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  int iVar1;
  IVec2 IVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  Vector<float,_4> local_1b8;
  Vector<float,_4> local_1a8;
  Vector<float,_4> local_198;
  Vector<float,_4> local_188;
  Vector<float,_4> local_178;
  undefined1 local_168 [8];
  Vec4 color3;
  undefined1 local_148 [8];
  Vec4 color2;
  undefined1 local_128 [8];
  Vec4 color1;
  undefined1 local_108 [8];
  Vec4 color0;
  Vec4 vtxColor3;
  Vec4 vtxColor2;
  Vec4 vtxColor1;
  Vec4 vtxColor0;
  Vec4 texColor3;
  Vec4 texColor2;
  Vec4 texColor1;
  Vec4 texColor0;
  Vector<int,_2> local_70;
  IVec2 position3;
  Vector<int,_2> local_60;
  IVec2 position2;
  Vector<int,_2> local_50;
  IVec2 position1;
  Vector<int,_2> local_40;
  IVec2 position0;
  FragmentPacket *packet;
  int packetNdx;
  FragmentShadingContext *context_local;
  int numPackets_local;
  FragmentPacket *packets_local;
  TextureFragmentShader *this_local;
  
  for (packet._4_4_ = 0; packet._4_4_ < numPackets; packet._4_4_ = packet._4_4_ + 1) {
    position0.m_data = (int  [2])(packets + packet._4_4_);
    tcu::Vector<int,_2>::Vector(&position1,0,0);
    tcu::operator+((tcu *)&local_40,&packets[packet._4_4_].position,&position1);
    IVar2 = position0;
    tcu::Vector<int,_2>::Vector(&position2,1,0);
    tcu::operator+((tcu *)&local_50,(Vector<int,_2> *)IVar2.m_data,&position2);
    IVar2 = position0;
    tcu::Vector<int,_2>::Vector(&position3,0,1);
    tcu::operator+((tcu *)&local_60,(Vector<int,_2> *)IVar2.m_data,&position3);
    IVar2 = position0;
    tcu::Vector<int,_2>::Vector((Vector<int,_2> *)(texColor0.m_data + 2),1,1);
    tcu::operator+((tcu *)&local_70,(Vector<int,_2> *)IVar2.m_data,
                   (Vector<int,_2> *)(texColor0.m_data + 2));
    iVar1 = (int)this;
    iVar3 = tcu::Vector<int,_2>::x(&local_40);
    iVar4 = tcu::Vector<int,_2>::y(&local_40);
    iVar5 = tcu::ConstPixelBufferAccess::getWidth(&this->m_texture);
    iVar3 = de::clamp<int>(iVar3 * iVar4,0,iVar5 + -1);
    tcu::ConstPixelBufferAccess::getPixel
              ((ConstPixelBufferAccess *)(texColor1.m_data + 2),iVar1 + 0x38,iVar3,0);
    iVar3 = tcu::Vector<int,_2>::x(&local_50);
    iVar4 = tcu::Vector<int,_2>::y(&local_50);
    iVar5 = tcu::ConstPixelBufferAccess::getWidth(&this->m_texture);
    iVar3 = de::clamp<int>(iVar3 * iVar4,0,iVar5 + -1);
    tcu::ConstPixelBufferAccess::getPixel
              ((ConstPixelBufferAccess *)(texColor2.m_data + 2),iVar1 + 0x38,iVar3,0);
    iVar3 = tcu::Vector<int,_2>::x(&local_60);
    iVar4 = tcu::Vector<int,_2>::y(&local_60);
    iVar5 = tcu::ConstPixelBufferAccess::getWidth(&this->m_texture);
    iVar3 = de::clamp<int>(iVar3 * iVar4,0,iVar5 + -1);
    tcu::ConstPixelBufferAccess::getPixel
              ((ConstPixelBufferAccess *)(texColor3.m_data + 2),iVar1 + 0x38,iVar3,0);
    iVar3 = tcu::Vector<int,_2>::x(&local_70);
    iVar4 = tcu::Vector<int,_2>::y(&local_70);
    iVar5 = tcu::ConstPixelBufferAccess::getWidth(&this->m_texture);
    iVar3 = de::clamp<int>(iVar3 * iVar4,0,iVar5 + -1);
    tcu::ConstPixelBufferAccess::getPixel
              ((ConstPixelBufferAccess *)(vtxColor0.m_data + 2),iVar1 + 0x38,iVar3,0);
    rr::readVarying<float>
              ((rr *)(vtxColor1.m_data + 2),(FragmentPacket *)position0.m_data,context,0,0);
    rr::readVarying<float>
              ((rr *)(vtxColor2.m_data + 2),(FragmentPacket *)position0.m_data,context,0,1);
    rr::readVarying<float>
              ((rr *)(vtxColor3.m_data + 2),(FragmentPacket *)position0.m_data,context,0,2);
    rr::readVarying<float>((rr *)(color0.m_data + 2),(FragmentPacket *)position0.m_data,context,0,3)
    ;
    tcu::operator+((tcu *)(color1.m_data + 2),(Vector<float,_4> *)(vtxColor1.m_data + 2),
                   (Vector<float,_4> *)(texColor1.m_data + 2));
    tcu::operator*((tcu *)local_108,0.5,(Vector<float,_4> *)(color1.m_data + 2));
    tcu::operator+((tcu *)(color2.m_data + 2),(Vector<float,_4> *)(vtxColor2.m_data + 2),
                   (Vector<float,_4> *)(texColor2.m_data + 2));
    tcu::operator*((tcu *)local_128,0.5,(Vector<float,_4> *)(color2.m_data + 2));
    tcu::operator+((tcu *)(color3.m_data + 2),(Vector<float,_4> *)(vtxColor3.m_data + 2),
                   (Vector<float,_4> *)(texColor3.m_data + 2));
    tcu::operator*((tcu *)local_148,0.5,(Vector<float,_4> *)(color3.m_data + 2));
    tcu::operator+((tcu *)&local_178,(Vector<float,_4> *)(color0.m_data + 2),
                   (Vector<float,_4> *)(vtxColor0.m_data + 2));
    tcu::operator*((tcu *)local_168,0.5,&local_178);
    fVar6 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_108);
    fVar7 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_108);
    fVar8 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_108);
    fVar9 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_108);
    fVar10 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_108);
    fVar11 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_108);
    tcu::Vector<float,_4>::Vector(&local_188,fVar6 * fVar7,fVar8 * fVar9,fVar10 * fVar11,1.0);
    rr::writeFragmentOutput<tcu::Vector<float,4>>(context,packet._4_4_,0,0,&local_188);
    fVar6 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_128);
    fVar7 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_128);
    fVar8 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_128);
    fVar9 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_128);
    fVar10 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_128);
    fVar11 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_128);
    tcu::Vector<float,_4>::Vector(&local_198,fVar6 * fVar7,fVar8 * fVar9,fVar10 * fVar11,1.0);
    rr::writeFragmentOutput<tcu::Vector<float,4>>(context,packet._4_4_,1,0,&local_198);
    fVar6 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_148);
    fVar7 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_148);
    fVar8 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_148);
    fVar9 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_148);
    fVar10 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_148);
    fVar11 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_148);
    tcu::Vector<float,_4>::Vector(&local_1a8,fVar6 * fVar7,fVar8 * fVar9,fVar10 * fVar11,1.0);
    rr::writeFragmentOutput<tcu::Vector<float,4>>(context,packet._4_4_,2,0,&local_1a8);
    fVar6 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_168);
    fVar7 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_168);
    fVar8 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_168);
    fVar9 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_168);
    fVar10 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_168);
    fVar11 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_168);
    tcu::Vector<float,_4>::Vector(&local_1b8,fVar6 * fVar7,fVar8 * fVar9,fVar10 * fVar11,1.0);
    rr::writeFragmentOutput<tcu::Vector<float,4>>(context,packet._4_4_,3,0,&local_1b8);
  }
  return;
}

Assistant:

void shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
	{
		for (int packetNdx = 0; packetNdx < numPackets; packetNdx++)
		{
			rr::FragmentPacket&	packet		= packets[packetNdx];

			const tcu::IVec2	position0	= packet.position + tcu::IVec2(0, 0);
			const tcu::IVec2	position1	= packet.position + tcu::IVec2(1, 0);
			const tcu::IVec2	position2	= packet.position + tcu::IVec2(0, 1);
			const tcu::IVec2	position3	= packet.position + tcu::IVec2(1, 1);

			const tcu::Vec4		texColor0	= m_texture.getPixel(de::clamp((position0.x() * position0.y()), 0, m_texture.getWidth()-1), 0);
			const tcu::Vec4		texColor1	= m_texture.getPixel(de::clamp((position1.x() * position1.y()), 0, m_texture.getWidth()-1), 0);
			const tcu::Vec4		texColor2	= m_texture.getPixel(de::clamp((position2.x() * position2.y()), 0, m_texture.getWidth()-1), 0);
			const tcu::Vec4		texColor3	= m_texture.getPixel(de::clamp((position3.x() * position3.y()), 0, m_texture.getWidth()-1), 0);

			const tcu::Vec4		vtxColor0	= rr::readVarying<float>(packet, context, 0, 0);
			const tcu::Vec4		vtxColor1	= rr::readVarying<float>(packet, context, 0, 1);
			const tcu::Vec4		vtxColor2	= rr::readVarying<float>(packet, context, 0, 2);
			const tcu::Vec4		vtxColor3	= rr::readVarying<float>(packet, context, 0, 3);

			const tcu::Vec4		color0		= 0.5f * (vtxColor0 + texColor0);
			const tcu::Vec4		color1		= 0.5f * (vtxColor1 + texColor1);
			const tcu::Vec4		color2		= 0.5f * (vtxColor2 + texColor2);
			const tcu::Vec4		color3		= 0.5f * (vtxColor3 + texColor3);

			rr::writeFragmentOutput(context, packetNdx, 0, 0, tcu::Vec4(color0.x() * color0.w(), color0.y() * color0.w(), color0.z() * color0.w(), 1.0f));
			rr::writeFragmentOutput(context, packetNdx, 1, 0, tcu::Vec4(color1.x() * color1.w(), color1.y() * color1.w(), color1.z() * color1.w(), 1.0f));
			rr::writeFragmentOutput(context, packetNdx, 2, 0, tcu::Vec4(color2.x() * color2.w(), color2.y() * color2.w(), color2.z() * color2.w(), 1.0f));
			rr::writeFragmentOutput(context, packetNdx, 3, 0, tcu::Vec4(color3.x() * color3.w(), color3.y() * color3.w(), color3.z() * color3.w(), 1.0f));
		}
	}